

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_check_version(lys_module *module,lys_submodule *submodule,char *value,int repeat)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  LY_ECODE code;
  char *pcVar4;
  
  if (repeat == 0) {
    if ((*value != '1') || (value[1] != '\0')) {
      iVar2 = strcmp(value,"1.1");
      if (iVar2 == 0) {
        if (submodule != (lys_submodule *)0x0) {
          if ((module->field_0x40 & 0xe) == 4) goto LAB_00146fec;
          goto LAB_00146fce;
        }
        bVar1 = module->field_0x40 & 0xf1 | 4;
        goto LAB_00146fe8;
      }
      pcVar4 = "yang-version";
      code = LYE_INARG;
      pcVar3 = value;
      goto LAB_00146f8f;
    }
    if (submodule == (lys_submodule *)0x0) {
      bVar1 = module->field_0x40 & 0xf1 | 2;
LAB_00146fe8:
      module->field_0x40 = bVar1;
LAB_00146fec:
      iVar2 = 0;
      goto LAB_00146f9a;
    }
    if ((module->field_0x40 & 0xc) == 0) goto LAB_00146fec;
LAB_00146fce:
    ly_vlog(LYE_INVER,LY_VLOG_NONE,(void *)0x0);
  }
  else {
    pcVar4 = "module";
    code = LYE_TOOMANY;
    pcVar3 = "yang version";
LAB_00146f8f:
    ly_vlog(code,LY_VLOG_NONE,(void *)0x0,pcVar3,pcVar4);
  }
  iVar2 = 1;
LAB_00146f9a:
  free(value);
  return iVar2;
}

Assistant:

int
yang_check_version(struct lys_module *module, struct lys_submodule *submodule, char *value, int repeat)
{
    int ret = EXIT_SUCCESS;

    if (repeat) {
        LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "yang version", "module");
        ret = EXIT_FAILURE;
    } else {
        if (!strcmp(value, "1")) {
            if (submodule) {
                if (module->version > 1) {
                    LOGVAL(LYE_INVER, LY_VLOG_NONE, NULL);
                    ret = EXIT_FAILURE;
                 }
            } else {
                module->version = 1;
            }
        } else if (!strcmp(value, "1.1")) {
            if (submodule) {
                if (module->version != 2) {
                    LOGVAL(LYE_INVER, LY_VLOG_NONE, NULL);
                    ret = EXIT_FAILURE;
                }
            } else {
                module->version = 2;
            }
        } else {
            LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "yang-version");
            ret = EXIT_FAILURE;
        }
    }
    free(value);
    return ret;
}